

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O3

bool __thiscall
SMC::grow_one_with_sc
          (SMC *this,Structure *CurConf,int Position,int tmpEnd,int LoopChosen,Atom *EndPt)

{
  double *pdVar1;
  short sVar2;
  uint uVar3;
  Atom *pAVar4;
  Residue *pRVar5;
  Atom *pAVar6;
  undefined8 uVar7;
  int i;
  ulong uVar8;
  void *pvVar9;
  ostream *poVar10;
  uint uVar11;
  undefined1 (*pauVar12) [16];
  Residue *pRVar13;
  long lVar14;
  size_type __n;
  ulong uVar15;
  Residue *pRVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  pointer *ppdVar21;
  Residue *pRVar22;
  bool bVar23;
  int iVar24;
  double (*padVar25) [6];
  long lVar26;
  void *__s;
  double (*__s_00) [6];
  long lVar27;
  double dVar28;
  double dVar29;
  pointer pdVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auStack_1c98 [248];
  double adStack_1ba0 [2];
  Point PStack_1b90;
  Point PStack_1b78;
  Point PStack_1b60;
  undefined1 auStack_1b48 [8];
  vector<double,_std::allocator<double>_> prob;
  int local_c48 [2];
  int deadlabel [160];
  int Phi [160];
  int Psi [160];
  int TorProb [160];
  Residue sam;
  void *local_98;
  double local_68;
  
  uVar3 = this->num_dist_states;
  uVar17 = (ulong)uVar3;
  lVar14 = -(uVar17 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar27 = lVar14 + -0x1b48;
  pAVar4 = CurConf->_res[Position]._atom;
  dVar28 = pAVar4[1].super_Point.x - (EndPt->super_Point).x;
  dVar33 = pAVar4[1].super_Point.y - (EndPt->super_Point).y;
  dVar34 = pAVar4[1].super_Point.z - (EndPt->super_Point).z;
  dVar33 = SQRT(dVar34 * dVar34 + dVar28 * dVar28 + dVar33 * dVar33);
  uVar11 = tmpEnd - Position;
  dVar28 = this->minDistcon[1][(int)uVar11];
  bVar23 = false;
  if ((dVar28 <= dVar33) &&
     (bVar23 = false, dVar33 <= this->DistconBy[1][(int)uVar11] * 31.0 + dVar28)) {
    dVar28 = *(double *)((long)(this->minDistcon + -1) + ((long)(int)uVar11 + 0x13) * 8);
    dVar34 = this->DistconBy[-1][(long)(int)uVar11 + 0x13];
    sVar2 = CurConf->_res[Position]._type;
    lVar26 = 0;
    *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x12200d;
    memset(local_c48,0,0x280);
    ppdVar21 = &prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pRVar16 = (Residue *)(TorProb + 0x9e);
    iVar24 = 0;
    do {
      *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x122052;
      Residue::Residue(pRVar16,0x1e);
      Psi[lVar26 + 0x9e] = -1;
      pAVar4 = CurConf->_res[Position]._atom;
      dVar29 = Residue::bond_angle[sVar2][2];
      dVar35 = Residue::bond_length[sVar2][2];
      *(ulong *)(auStack_1b48 + lVar14 + -0x10) = (ulong)uVar11;
      *(undefined8 *)((long)&PStack_1b60 + lVar14) = 0x1220ba;
      sample_distance(this,pAVar4,pAVar4 + 1,EndPt,dVar29,dVar35,(Atom *)(TorProb._632_8_ + 0xa0),
                      dVar33,1,*(int *)(auStack_1b48 + lVar14 + -0x10));
      if (((0x7fefffffffffffff < (ulong)ABS(*(double *)(TorProb._632_8_ + 0xa0))) ||
          (dVar29 = *(double *)(TorProb._632_8_ + 0xa0) - (EndPt->super_Point).x,
          dVar35 = *(double *)(TorProb._632_8_ + 0xa8) - (EndPt->super_Point).y,
          dVar38 = *(double *)(TorProb._632_8_ + 0xb0) - (EndPt->super_Point).z,
          dVar29 = SQRT(dVar38 * dVar38 + dVar29 * dVar29 + dVar35 * dVar35), dVar29 < dVar28)) ||
         (dVar34 * 31.0 + dVar28 < dVar29)) {
LAB_001220e7:
        Psi[lVar26 + 0x9e] = 0;
        local_c48[lVar26] = 1;
        iVar24 = iVar24 + 1;
      }
      else {
        pAVar4 = CurConf->_res[Position]._atom;
        dVar35 = Residue::bond_angle[sVar2][0];
        dVar38 = Residue::bond_length[sVar2][0];
        *(ulong *)(auStack_1b48 + lVar14 + -0x10) = (ulong)(uVar11 - 1);
        *(undefined8 *)((long)&PStack_1b60 + lVar14) = 0x1221c8;
        sample_distance(this,pAVar4 + 1,(Atom *)(TorProb._632_8_ + 0xa0),EndPt,dVar35,dVar38,
                        (Atom *)TorProb._632_8_,dVar29,0,*(int *)(auStack_1b48 + lVar14 + -0x10));
        if (0x7fefffffffffffff < (*(ulong *)TorProb._632_8_ & 0x7fffffffffffffff))
        goto LAB_001220e7;
        pAVar4 = CurConf->_res[(long)Position + -1]._atom;
        pAVar6 = CurConf->_res[Position]._atom;
        *(undefined8 *)(auStack_1b48 + lVar14 + -8) = *(undefined8 *)(TorProb._632_8_ + 0xb0);
        uVar7 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
        *(undefined8 *)((long)&PStack_1b60 + lVar14) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
        *(undefined8 *)(auStack_1b48 + lVar14 + -0x10) = uVar7;
        *(double *)((long)&PStack_1b78 + lVar14 + 0x10) = pAVar6[1].super_Point.z;
        dVar29 = pAVar6[1].super_Point.y;
        *(double *)((long)&PStack_1b78 + lVar14) = pAVar6[1].super_Point.x;
        *(double *)((long)&PStack_1b78 + lVar14 + 8) = dVar29;
        *(double *)((long)&PStack_1b90 + lVar14 + 0x10) = (pAVar6->super_Point).z;
        dVar29 = (pAVar6->super_Point).y;
        *(double *)((long)&PStack_1b90 + lVar14) = (pAVar6->super_Point).x;
        *(double *)((long)&PStack_1b90 + lVar14 + 8) = dVar29;
        *(double *)((long)adStack_1ba0 + lVar14 + 8) = pAVar4[2].super_Point.z;
        dVar29 = pAVar4[2].super_Point.y;
        *(double *)(auStack_1c98 + lVar14 + 0xf0) = pAVar4[2].super_Point.x;
        *(double *)((long)adStack_1ba0 + lVar14) = dVar29;
        *(undefined8 *)(auStack_1c98 + lVar14 + 0xe8) = 0x12226d;
        dVar29 = torsion(*(Point *)(auStack_1c98 + lVar14 + 0xf0),
                         *(Point *)((long)&PStack_1b90 + lVar14),
                         *(Point *)((long)&PStack_1b78 + lVar14),
                         *(Point *)((long)&PStack_1b60 + lVar14),torsion_degrees);
        ppdVar21[-2] = (pointer)dVar29;
        pAVar4 = CurConf->_res[Position]._atom;
        *(undefined8 *)(auStack_1b48 + lVar14 + -8) = *(undefined8 *)(TorProb._632_8_ + 0x10);
        uVar7 = *(undefined8 *)(TorProb._632_8_ + 8);
        *(undefined8 *)((long)&PStack_1b60 + lVar14) = *(undefined8 *)TorProb._632_8_;
        *(undefined8 *)(auStack_1b48 + lVar14 + -0x10) = uVar7;
        *(undefined8 *)((long)&PStack_1b78 + lVar14 + 0x10) =
             *(undefined8 *)(TorProb._632_8_ + 0xb0);
        uVar7 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
        *(undefined8 *)((long)&PStack_1b78 + lVar14) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
        *(undefined8 *)((long)&PStack_1b78 + lVar14 + 8) = uVar7;
        *(double *)((long)&PStack_1b90 + lVar14 + 0x10) = pAVar4[1].super_Point.z;
        dVar29 = pAVar4[1].super_Point.y;
        *(double *)((long)&PStack_1b90 + lVar14) = pAVar4[1].super_Point.x;
        *(double *)((long)&PStack_1b90 + lVar14 + 8) = dVar29;
        *(double *)((long)adStack_1ba0 + lVar14 + 8) = (pAVar4->super_Point).z;
        dVar29 = (pAVar4->super_Point).y;
        *(double *)(auStack_1c98 + lVar14 + 0xf0) = (pAVar4->super_Point).x;
        *(double *)((long)adStack_1ba0 + lVar14) = dVar29;
        *(undefined8 *)(auStack_1c98 + lVar14 + 0xe8) = 0x1222e6;
        pdVar30 = (pointer)torsion(*(Point *)(auStack_1c98 + lVar14 + 0xf0),
                                   *(Point *)((long)&PStack_1b90 + lVar14),
                                   *(Point *)((long)&PStack_1b78 + lVar14),
                                   *(Point *)((long)&PStack_1b60 + lVar14),torsion_degrees);
        ((_Vector_impl_data *)(ppdVar21 + -1))->_M_start = pdVar30;
        *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x122308;
        box_MullerNsample_single((double *)ppdVar21,3.14159265358979,0.06981317007977311);
        if (0x7fefffffffffffff < ((ulong)*ppdVar21 & 0x7fffffffffffffff)) goto LAB_001220e7;
      }
      *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x12210a;
      Residue::~Residue(pRVar16);
      lVar26 = lVar26 + 1;
      ppdVar21 = ppdVar21 + 3;
    } while (lVar26 != 0xa0);
    if (iVar24 == 0xa0) {
      bVar23 = false;
    }
    else {
      lVar26 = 0;
      pauVar12 = (undefined1 (*) [16])auStack_1b48;
      iVar24 = 0;
      do {
        if (Psi[lVar26 + 0x9e] == -1) {
          auVar45 = divpd(*pauVar12,_DAT_0014b120);
          iVar41 = (int)auVar45._0_8_;
          iVar42 = (int)auVar45._8_8_;
          iVar43 = iVar41 + (int)DAT_0014b130;
          iVar44 = iVar42 + DAT_0014b130._4_4_;
          auVar37._8_8_ = -(ulong)(auVar45._8_8_ + 36.0 < (double)iVar44);
          auVar37._0_8_ = -(ulong)(auVar45._0_8_ + 36.0 < (double)iVar43);
          uVar11 = movmskpd((int)pRVar16,auVar37);
          if ((uVar11 & 1) != 0) {
            iVar43 = iVar41 + 0x23;
          }
          if ((uVar11 & 2) != 0) {
            iVar44 = iVar42 + 0x23;
          }
          deadlabel[lVar26 + 0x9e] = iVar43;
          Phi[lVar26 + 0x9e] = iVar44;
          pRVar16 = (Residue *)(long)iVar44;
          iVar43 = this->Joint_Angle[sVar2][iVar43][(long)pRVar16];
          Psi[lVar26 + 0x9e] = iVar43;
          iVar24 = iVar24 + iVar43;
        }
        lVar26 = lVar26 + 1;
        pauVar12 = (undefined1 (*) [16])(pauVar12[1] + 8);
      } while (lVar26 != 0xa0);
      if ((iVar24 == 0) || (this->use_rot_lib != true)) {
        if (0 < (int)uVar3) {
          uVar18 = 0;
          do {
            *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x122561;
            iVar24 = rand();
            do {
              lVar26 = (long)(iVar24 % 0xa0);
              iVar24 = iVar24 + 1 + (iVar24 / 0xa0) * -0xa0;
            } while (local_c48[lVar26] == 1);
            *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x12259a;
            iVar43 = rand();
            iVar24 = deadlabel[lVar26 + 0x9e];
            *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x1225b4;
            iVar44 = rand();
            auVar45._0_8_ = (double)iVar43 + 0.5;
            auVar45._8_8_ = (double)iVar44 + 0.5;
            auVar45 = divpd(auVar45,_DAT_0014b160);
            auVar40._0_8_ = (double)(iVar24 + -0x23) * (double)DAT_0014b190;
            auVar40._8_8_ = (double)(Phi[lVar26 + 0x9e] + -0x23) * DAT_0014b190._8_8_;
            auVar40 = divpd(auVar40,_DAT_0014b140);
            auVar47._0_8_ = (double)(iVar24 + -0x24) * (double)DAT_0014b190;
            auVar47._8_8_ = (double)(Phi[lVar26 + 0x9e] + -0x24) * DAT_0014b190._8_8_;
            auVar37 = divpd(auVar47,_DAT_0014b140);
            *(double *)(auStack_1b48 + uVar18 * 0x18 + lVar27 + 0x1b48) =
                 (auVar40._0_8_ - auVar37._0_8_) * auVar45._0_8_ + auVar37._0_8_;
            *(double *)((long)(auStack_1b48 + uVar18 * 0x18 + lVar27 + 0x1b48) + 8) =
                 (auVar40._8_8_ - auVar37._8_8_) * auVar45._8_8_ + auVar37._8_8_;
            *(pointer *)((long)&prob + uVar18 * 0x18 + lVar14 + 8) =
                 (&prob)[lVar26].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar17);
        }
      }
      else if (0 < (int)uVar3) {
        uVar18 = 0;
        do {
          *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x122447;
          iVar43 = rand();
          ppdVar21 = &prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          lVar26 = 0;
          iVar44 = 0;
          do {
            iVar44 = iVar44 + Psi[lVar26 + 0x9e];
            if (iVar43 % iVar24 < iVar44) {
              *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x12247c;
              iVar44 = rand();
              iVar43 = deadlabel[lVar26 + 0x9e];
              *(undefined8 *)(auStack_1b48 + lVar14 + -8) = 0x12249d;
              iVar41 = rand();
              auVar31._0_8_ = (double)iVar44 + 0.5;
              auVar31._8_8_ = (double)iVar41 + 0.5;
              auVar45 = divpd(auVar31,_DAT_0014b160);
              auVar39._0_8_ = (double)(iVar43 + -0x23) * (double)DAT_0014b190;
              auVar39._8_8_ = (double)(Phi[lVar26 + 0x9e] + -0x23) * DAT_0014b190._8_8_;
              auVar47 = divpd(auVar39,_DAT_0014b140);
              auVar36._0_8_ = (double)(iVar43 + -0x24) * (double)DAT_0014b190;
              auVar36._8_8_ = (double)(Phi[lVar26 + 0x9e] + -0x24) * DAT_0014b190._8_8_;
              auVar37 = divpd(auVar36,_DAT_0014b140);
              *(double *)(auStack_1b48 + uVar18 * 0x18 + lVar27 + 0x1b48) =
                   (auVar47._0_8_ - auVar37._0_8_) * auVar45._0_8_ + auVar37._0_8_;
              *(double *)((long)(auStack_1b48 + uVar18 * 0x18 + lVar27 + 0x1b48) + 8) =
                   (auVar47._8_8_ - auVar37._8_8_) * auVar45._8_8_ + auVar37._8_8_;
              *(pointer *)((long)&prob + uVar18 * 0x18 + lVar14 + 8) = *ppdVar21;
              break;
            }
            lVar26 = lVar26 + 1;
            ppdVar21 = ppdVar21 + 3;
          } while (lVar26 != 0xa0);
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar17);
      }
      uVar11 = this->num_sc_states;
      uVar15 = (ulong)uVar11;
      lVar14 = uVar15 * uVar17;
      __s_00 = (double (*) [6])(auStack_1b48 + lVar14 * -0x30 + lVar27 + 0x1b48);
      __s_00[-1][5] = 5.87709366157059e-318;
      memset(__s_00,0,(long)(int)(uVar3 * uVar11 * 6) << 3);
      uVar18 = uVar15;
      uVar19 = uVar17;
      padVar25 = __s_00;
      if (0 < (int)uVar3) {
        do {
          pRVar16 = CurConf->_res;
          iVar24 = this->num_sc_states;
          iVar43 = this->ang_type;
          __s_00[-1][5] = 5.87749879540018e-318;
          sample_sc_angles(pRVar16 + Position,padVar25,iVar24,iVar43);
          uVar19 = uVar19 - 1;
          padVar25 = padVar25 + uVar15;
        } while (uVar19 != 0);
        uVar18 = (ulong)(uint)this->num_sc_states;
        lVar14 = uVar18 * uVar17;
      }
      pRVar16 = (Residue *)(__s_00 + lVar14 * -7);
      if (lVar14 == 0) {
        lVar26 = 0;
        uVar19 = uVar18;
      }
      else {
        lVar26 = 0;
        do {
          pRVar16[-1]._center._posn = 0x122757;
          pRVar16[-1]._center._state = 0;
          *(undefined2 *)&pRVar16[-1]._center.field_0x4e = 0;
          Residue::Residue((Residue *)((long)pRVar16->_scChi + lVar26 + -0x28),0x1e);
          lVar26 = lVar26 + 0x150;
        } while (lVar14 * 0x150 != lVar26);
        lVar26 = (uint)this->num_sc_states * uVar17;
        uVar19 = (ulong)(uint)this->num_sc_states;
      }
      __s = (void *)((long)pRVar16 - (lVar26 * 8 + 0xfU & 0xfffffffffffffff0));
      __n = (size_type)(int)((int)uVar19 * uVar3);
      *(undefined8 *)((long)__s + -8) = 0x1227b5;
      memset(__s,0,__n * 8);
      if ((int)uVar3 < 1) {
        local_68 = 1.79769313486232e+308;
      }
      else {
        local_68 = 1.79769313486232e+308;
        uVar8 = 0;
        pRVar13 = pRVar16;
        uVar20 = uVar19;
        local_98 = __s;
        do {
          if (0 < (int)uVar20) {
            pdVar1 = (double *)(auStack_1b48 + uVar8 * 0x18 + lVar27 + 0x1b48);
            lVar26 = 0;
            pRVar22 = pRVar13;
            padVar25 = __s_00;
            do {
              pRVar5 = CurConf->_res;
              *(undefined8 *)((long)__s + -8) = 0x122876;
              Residue::operator=(pRVar22,pRVar5 + Position);
              dVar33 = *pdVar1;
              dVar34 = pdVar1[1];
              pRVar22->_phi = dVar33;
              pRVar22->_psi = dVar34;
              dVar28 = pdVar1[2];
              pRVar22->_omega = dVar28;
              *(undefined8 *)((long)__s + -8) = 0x1228a8;
              Structure::calBBCo(CurConf,Position,pRVar22,dVar33,dVar34,dVar28);
              *(undefined8 *)((long)__s + -8) = 0x1228b6;
              Structure::calSCCo(CurConf,*padVar25,pRVar22);
              *(undefined8 *)((long)__s + -8) = 0x1228c3;
              Structure::SinglecalCenter(CurConf,pRVar22,0);
              *(undefined8 *)((long)__s + -8) = 0x1228d5;
              dVar28 = one_res_en_loodis_all_list(CurConf,pRVar22,&this->Reslist);
              *(double *)((long)local_98 + lVar26 * 8) = dVar28;
              if (local_68 <= dVar28) {
                dVar28 = local_68;
              }
              lVar26 = lVar26 + 1;
              uVar20 = (ulong)this->num_sc_states;
              padVar25 = padVar25 + 1;
              pRVar22 = pRVar22 + 1;
              local_68 = dVar28;
            } while (lVar26 < (long)uVar20);
          }
          uVar8 = uVar8 + 1;
          local_98 = (void *)((long)local_98 + uVar19 * 8);
          __s_00 = __s_00 + uVar15;
          pRVar13 = pRVar13 + uVar18;
        } while (uVar8 != uVar17);
        __n = (size_type)(int)((int)uVar20 * uVar3);
      }
      deadlabel[0x9e] = 0;
      deadlabel[0x9f] = 0;
      *(undefined8 *)((long)__s + -8) = 0x122995;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)auStack_1b48,__n,
                 (value_type_conflict3 *)(deadlabel + 0x9e),(allocator_type *)(Phi + 0x9e));
      if (0 < (int)uVar3) {
        uVar15 = (ulong)(uint)this->num_sc_states;
        dVar28 = 0.0;
        uVar20 = 0;
        pvVar9 = __s;
        do {
          if (0 < (int)uVar15) {
            lVar27 = 0;
            do {
              dVar33 = *(double *)((long)pvVar9 + lVar27 * 8);
              *(undefined8 *)((long)__s + -8) = 0x1229f3;
              dVar33 = pow(2.718281828,(local_68 - dVar33) * 0.5);
              *(double *)((long)auStack_1b48 + ((int)uVar15 * (int)uVar20 + lVar27) * 8) = dVar33;
              if (0x7fefffffffffffff < (ulong)ABS(dVar33)) {
                *(undefined8 *)((long)__s + -8) = 0x122ef5;
                __assert_fail("std::isfinite(prob[k])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                              ,0x30d,
                              "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                             );
              }
              dVar28 = dVar28 + dVar33;
              if (0x7fefffffffffffff < (long)ABS(dVar28)) {
                *(undefined8 *)((long)__s + -8) = 0x122f14;
                __assert_fail("std::isfinite(sum)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                              ,0x314,
                              "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                             );
              }
              lVar27 = lVar27 + 1;
              uVar15 = (ulong)this->num_sc_states;
            } while (lVar27 < (long)uVar15);
          }
          auVar37 = _DAT_00149ab0;
          auVar45 = _DAT_00149aa0;
          uVar20 = uVar20 + 1;
          pvVar9 = (void *)((long)pvVar9 + uVar19 * 8);
        } while (uVar20 != uVar17);
        if (dVar28 <= 1e-10 && 0 < (int)uVar3) {
          uVar3 = this->num_sc_states;
          lVar27 = (ulong)uVar3 - 1;
          auVar32._8_4_ = (int)lVar27;
          auVar32._0_8_ = lVar27;
          auVar32._12_4_ = (int)((ulong)lVar27 >> 0x20);
          pdVar30 = (pointer)((long)auStack_1b48 + 8);
          uVar19 = 0;
          auVar32 = auVar32 ^ _DAT_00149ab0;
          do {
            if (0 < (int)uVar3) {
              lVar27 = 0;
              auVar46 = auVar45;
              do {
                auVar47 = auVar46 ^ auVar37;
                if ((bool)(~(auVar32._4_4_ < auVar47._4_4_ ||
                            auVar32._0_4_ < auVar47._0_4_ && auVar47._4_4_ == auVar32._4_4_) & 1)) {
                  *(undefined8 *)((long)pdVar30 + lVar27 + -8) = 0x3ff0000000000000;
                }
                if (auVar47._12_4_ <= auVar32._12_4_ &&
                    (auVar47._8_4_ <= auVar32._8_4_ || auVar47._12_4_ != auVar32._12_4_)) {
                  *(undefined8 *)((long)pdVar30 + lVar27) = 0x3ff0000000000000;
                }
                lVar26 = auVar46._8_8_;
                auVar46._0_8_ = auVar46._0_8_ + 2;
                auVar46._8_8_ = lVar26 + 2;
                lVar27 = lVar27 + 0x10;
              } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar27);
            }
            uVar19 = uVar19 + 1;
            pdVar30 = pdVar30 + uVar3;
          } while (uVar19 != uVar17);
        }
      }
      *(undefined8 *)((long)__s + -8) = 0x122b6d;
      iVar24 = SampleOne((vector<double,_std::allocator<double>_> *)auStack_1b48);
      pRVar13 = CurConf->_res;
      if ((pRVar13[Position]._type == -1) || (pRVar13[Position]._type == -0x3039)) {
        *(undefined8 *)((long)__s + -8) = 0x122f2c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"grow_one_bb_only atom type error ",0x21);
        *(undefined8 *)((long)__s + -8) = 0x122f3b;
        poVar10 = (ostream *)std::ostream::operator<<(&std::cout,Position);
        *(undefined8 *)((long)__s + -8) = 0x122f43;
        std::endl<char,std::char_traits<char>>(poVar10);
        *(undefined8 *)((long)__s + -8) = 0x122f4a;
        exit(0);
      }
      pAVar4 = pRVar13[Position]._atom;
      dVar28 = (pAVar4->super_Point).x;
      if (((((dVar28 == 0.0) && (!NAN(dVar28))) && (dVar28 = (pAVar4->super_Point).y, dVar28 == 0.0)
           ) && ((!NAN(dVar28) && (dVar28 = (pAVar4->super_Point).z, dVar28 == 0.0)))) &&
         (!NAN(dVar28))) {
        *(undefined8 *)((long)__s + -8) = 0x122f69;
        __assert_fail("!CurConf._res[Position]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x331,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      dVar28 = pAVar4[1].super_Point.x;
      if (((dVar28 == 0.0) && (!NAN(dVar28))) &&
         ((dVar28 = pAVar4[1].super_Point.y, dVar28 == 0.0 &&
          (((!NAN(dVar28) && (dVar28 = pAVar4[1].super_Point.z, dVar28 == 0.0)) && (!NAN(dVar28)))))
         )) {
        *(undefined8 *)((long)__s + -8) = 0x122f88;
        __assert_fail("!CurConf._res[Position]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x332,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      dVar28 = pAVar4[2].super_Point.x;
      if ((((dVar28 != 0.0) || (NAN(dVar28))) ||
          ((dVar28 = pAVar4[2].super_Point.y, dVar28 != 0.0 ||
           ((NAN(dVar28) || (dVar28 = pAVar4[2].super_Point.z, dVar28 != 0.0)))))) || (NAN(dVar28)))
      {
        *(undefined8 *)((long)__s + -8) = 0x122fa7;
        __assert_fail("CurConf._res[Position]._atom[ATM_C].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x333,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      dVar28 = pAVar4[3].super_Point.x;
      if ((((dVar28 != 0.0) || (NAN(dVar28))) || (dVar28 = pAVar4[3].super_Point.y, dVar28 != 0.0))
         || (((NAN(dVar28) || (dVar28 = pAVar4[3].super_Point.z, dVar28 != 0.0)) || (NAN(dVar28)))))
      {
        *(undefined8 *)((long)__s + -8) = 0x122fc6;
        __assert_fail("CurConf._res[Position]._atom[ATM_O].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x334,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      iVar43 = Position + 1;
      pAVar6 = pRVar13[iVar43]._atom;
      dVar28 = (pAVar6->super_Point).x;
      if (((dVar28 != 0.0) || (NAN(dVar28))) ||
         ((dVar28 = (pAVar6->super_Point).y, dVar28 != 0.0 ||
          (((NAN(dVar28) || (dVar28 = (pAVar6->super_Point).z, dVar28 != 0.0)) || (NAN(dVar28)))))))
      {
        *(undefined8 *)((long)__s + -8) = 0x122fe5;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x335,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      dVar28 = pAVar6[1].super_Point.x;
      if (((dVar28 != 0.0) || (NAN(dVar28))) ||
         (((dVar28 = pAVar6[1].super_Point.y, dVar28 != 0.0 ||
           ((NAN(dVar28) || (dVar28 = pAVar6[1].super_Point.z, dVar28 != 0.0)))) || (NAN(dVar28)))))
      {
        *(undefined8 *)((long)__s + -8) = 0x123004;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x336,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pRVar22 = pRVar16 + (long)(iVar24 % this->num_sc_states) +
                          uVar18 * (long)(iVar24 / this->num_sc_states);
      pAVar6 = pRVar22->_atom;
      *(undefined8 *)((long)__s + -8) = 0x122d54;
      Atom::CopyPos(pAVar4 + 2,pAVar6 + 2);
      pAVar4 = CurConf->_res[Position]._atom;
      pAVar6 = pRVar22->_atom;
      *(undefined8 *)((long)__s + -8) = 0x122d70;
      Atom::CopyPos(pAVar4 + 3,pAVar6 + 3);
      pAVar4 = CurConf->_res[iVar43]._atom;
      pAVar6 = pRVar22->_atom;
      *(undefined8 *)((long)__s + -8) = 0x122d80;
      Atom::CopyPos(pAVar4,pAVar6);
      pAVar4 = CurConf->_res[iVar43]._atom;
      pAVar6 = pRVar22->_atom;
      *(undefined8 *)((long)__s + -8) = 0x122d98;
      Atom::CopyPos(pAVar4 + 1,pAVar6 + 1);
      pRVar13 = CurConf->_res;
      if (pRVar13[Position]._type != 5) {
        pAVar4 = pRVar13[Position]._atom;
        dVar28 = pAVar4[5].super_Point.x;
        if (((((dVar28 != 0.0) || (NAN(dVar28))) ||
             (dVar28 = pAVar4[5].super_Point.y, dVar28 != 0.0)) ||
            ((NAN(dVar28) || (dVar28 = pAVar4[5].super_Point.z, dVar28 != 0.0)))) || (NAN(dVar28)))
        {
          *(undefined8 *)((long)__s + -8) = 0x123023;
          __assert_fail("CurConf._res[Position]._atom[ATM_CB].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x347,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        pAVar6 = pRVar22->_atom;
        *(undefined8 *)((long)__s + -8) = 0x122e13;
        Atom::CopyPos(pAVar4 + 5,pAVar6 + 5);
        pRVar13 = CurConf->_res;
        if (pRVar22->_numAtom != pRVar13[Position]._numAtom) {
          *(undefined1 **)((long)__s + -8) = &LAB_00123042;
          __assert_fail("chosen_res._numAtom == CurConf._res[Position]._numAtom",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x34b,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        if (6 < pRVar22->_numAtom) {
          lVar27 = 6;
          lVar26 = 0x1e0;
          do {
            pAVar4 = pRVar13[Position]._atom;
            pAVar6 = pRVar22->_atom;
            *(undefined8 *)((long)__s + -8) = 0x122e54;
            Atom::CopyPos((Atom *)((long)&(pAVar4->super_Point).x + lVar26),
                          (Atom *)((long)&(pAVar6->super_Point).x + lVar26));
            lVar27 = lVar27 + 1;
            pRVar13 = CurConf->_res;
            lVar26 = lVar26 + 0x50;
          } while (lVar27 < pRVar13[Position]._numAtom);
        }
      }
      *(undefined8 *)((long)__s + -8) = 0x122e80;
      Structure::SinglecalCenter(CurConf,pRVar13 + Position,0);
      if (auStack_1b48 != (undefined1  [8])0x0) {
        *(undefined8 *)((long)__s + -8) = 0x122e91;
        operator_delete((void *)auStack_1b48);
      }
      bVar23 = true;
      if (lVar14 != 0) {
        lVar14 = lVar14 * 0x150;
        do {
          *(undefined8 *)((long)__s + -8) = 0x122ebb;
          Residue::~Residue((Residue *)((long)pRVar16[-1]._scChi + lVar14 + -0x28));
          lVar14 = lVar14 + -0x150;
        } while (lVar14 != 0);
      }
    }
  }
  return bVar23;
}

Assistant:

bool SMC::grow_one_with_sc(Structure &CurConf, const int Position, const int tmpEnd, const int LoopChosen,
                           const Atom &EndPt) {

    // Initialize positional values
    int phi_int, psi_int;

    // Initialize numbers of backbone states
    const int NumBBStates = this->num_dist_states;

    // The current residue
    const int CurResType = CurConf._res[Position]._type;

    // Placeholders for sampling
    DECLARE_VLA_2D(double, bb_angles, NumBBStates, 3);

    const int binNum = 180 / BBTbinSize;
    const double EEdisC = CurConf._res[Position]._atom[ATM_CA].dis(EndPt);
    double EEdisN = 0;

    const int RemLength = tmpEnd - Position;
    const double minEEDisC = minDistcon[1][RemLength];
    const double maxEEDisC = minDistcon[1][RemLength] + 31 * DistconBy[1][RemLength];
    const double minEEDisN = minDistcon[0][RemLength - 1];
    const double maxEEDisN = minDistcon[0][RemLength - 1] + 31 * DistconBy[0][RemLength - 1];
    
    int num_dead_labels = 0;

    /////////////////////////////////////////////////////////////////
    // Sample end-to-end distances and convert to positions.
    // End-to-end distances are sampled from an empirical distribution
    /////////////////////////////////////////////////////////////////

    // Early out if distance constraints are not satisfied
    // for carbon atom
    if (EEdisC < minEEDisC || EEdisC > maxEEDisC) {
        return false;
    }

    // BEGIN LargeNumDistanceStates scope
    {
        const int LargeNumDistanceStates = 160;
        DECLARE_VLA_2D(double, larbb_angles, LargeNumDistanceStates, 3);

        DECLARE_VLA_1D(int, Phi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, Psi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, TorProb, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, deadlabel, LargeNumDistanceStates);

        SET_VLA_1D(int, deadlabel, LargeNumDistanceStates, 0);

        // Loop through states
        for (int i = 0; i < LargeNumDistanceStates; i++) {
            // Initialize four residues for this sample
            Residue sam;
            // Sample new points for C atom based on distance to final C
            TorProb[i] = -1;

            // Sample carbon atom
            sample_distance(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            EndPt,
                            Residue::bond_angle[CurResType][ATM_C],
                            Residue::bond_length[CurResType][ATM_C],
                            sam._atom[ATM_C], EEdisC,
                            1, RemLength);

            // Skip if sampling failed (and try again)
            if (conditional_mark_dead_label(sam._atom[ATM_C].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Sample new points for N atom based on distance to final C
            EEdisN = sam._atom[ATM_C].dis(EndPt);
            if (EEdisN >= minEEDisN && EEdisN <= maxEEDisN) {
                sample_distance(CurConf._res[Position]._atom[ATM_CA],
                                sam._atom[ATM_C],
                                EndPt,
                                Residue::bond_angle[CurResType][ATM_N],
                                Residue::bond_length[CurResType][ATM_N],
                                sam._atom[ATM_N], EEdisN,
                                // -1 since it's NEXT N
                                0, RemLength - 1);
            }
            else {
                TorProb[i] = 0;
                deadlabel[i] = 1;
                ++num_dead_labels;
                continue;
            }

            if (conditional_mark_dead_label(sam._atom[ATM_N].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Populate remainder of bb_angles with the torsion angles
            // implied by the positional selections for C and N. This is for
            // unity with the existing code base. Omega = pi by default.
            // Note: PI/180 converts from degrees to radians
            larbb_angles[i][eix_phi] =
                    torsion(CurConf._res[Position - 1]._atom[ATM_C],
                            CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C], torsion_degrees);
            larbb_angles[i][eix_psi] =
                    torsion(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C],
                            sam._atom[ATM_N], torsion_degrees);
            // Sample omega (peptide bond) angle from normal distribution
            box_MullerNsample_single(larbb_angles[i][eix_omega], PI, TO_RAD(4));

            // Box muller can return NaN because frand(0,1) can return value > 1 which
            // causes a negative log. This is due to weird FRAND padding with +0.5.
            // The fix is to use the <random> library which handles interval sampling properly.
            conditional_mark_dead_label(larbb_angles[i][eix_omega], TorProb[i], deadlabel[i], num_dead_labels);
        }

        // need to check if all are dead as could infinite loop forever
        if (num_dead_labels == LargeNumDistanceStates) {
            return false;
        }

        /////////////////////////////////////////////////////////////////
        // Of the candidates sampled from end-to-end distance distribution,
        //  select a subset of the generated candidates according to empirical
        //  phi, psi distribution.
        /////////////////////////////////////////////////////////////////

        // Typically, we now have LargeNumDistanceStates # of candidates
        // which have phi, psi torsion angles as determined by sampling
        // from empirical distance distribution. The next step is to select
        // a subset of the candidates (specifically a subset of size
        // NumStates) according to the empirical joint distribution of
        // phi, psi angles for the current residue being grown.
        {
            // @TODO - factor this out into a function, it's a bit
            // tricky because of the VLA arrays, but the best candidate
            // refactoring would be Method-to-Class where local variables
            // become the class variables

            int Total = 0;
            // This loop tallies up how many instances of the discretized
            // (phi, psi) pair have been observed. "TorProb" is actually a
            // misnomer (but effectively functions the same way when combined
            // with "Total" variable) as it is actually an observation count
            // and not a normalized probability.
            for (int i = 0; i < LargeNumDistanceStates; ++i) {

                if (TorProb[i] == -1) {
                    phi_int = (int)(larbb_angles[i][eix_phi] / BBTbinSize) + binNum;
                    psi_int = (int)(larbb_angles[i][eix_psi] / BBTbinSize) + binNum;

                    if (larbb_angles[i][eix_phi] / BBTbinSize + binNum - phi_int < 0)
                        --phi_int;
                    if (larbb_angles[i][eix_psi] / BBTbinSize + binNum - psi_int < 0)
                        --psi_int;
                    Phi[i] = phi_int;
                    Psi[i] = psi_int;

                    TorProb[i] = Joint_Angle[CurResType][phi_int][psi_int];
                    Total += TorProb[i];
                }
            }

            // Check if rotamer library usage has been enabled. The phi, psi
            // backbone libraries are histograms with observed phi, psi counts
            // for a training set of several thousand (~10k) loop samples.
            // However, the histograms have not been smoothed and therefore are
            // somewhat sparse and can make it hard to generate clash free loops.
            // In practice, using the rotamer libraries may lead to loop samples
            // with better RMSD to target structures - but with a cost of potentially
            // higher Lennard Jones potential energy.

            // Now actually select a smaller subset of candidates based on empirical
            // (phi, psi) distribution:
            if ((0 == Total) || !use_rot_lib) {
                for (int i = 0; i < NumBBStates; ++i) {
                    // @TODO - use actual uniform distribution
                    int r = rand() % LargeNumDistanceStates;
                    // Skip to next valid sampled state
                    while (1 == deadlabel[r])
                        r = ((r + 1) % LargeNumDistanceStates);

                    bb_angles[i][eix_phi] = frand((double)((Phi[r] - binNum) * PI / binNum),
                        (double)((Phi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_psi] = frand((double)((Psi[r] - binNum) * PI / binNum),
                        (double)((Psi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_omega] = larbb_angles[r][eix_omega];
                    continue;
                }
            }
            else {
                for (int i = 0; i < NumBBStates; ++i) {
                    // Select a random bin
                    int r = rand() % Total;
                    int cur = 0;
                    for (int j = 0; j < LargeNumDistanceStates; j++) {
                        cur += TorProb[j];
                        if (r < cur) {
                            // Select a random set of torsion angles within selected bin
                            bb_angles[i][eix_phi] = frand((double) ((Phi[j] - binNum) * PI / binNum),
                                                    (double) ((Phi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_psi] = frand((double) ((Psi[j] - binNum) * PI / binNum),
                                                    (double) ((Psi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_omega] = larbb_angles[j][eix_omega];
                            break;
                        }
                    }
                }
            }
        } // end select subset of backbone angles
    }